

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pseudo-types.cpp
# Opt level: O3

void yactfr::internal::anon_unknown_23::validatePseudoUIntTypeRoles
               (PseudoDt *pseudoDt,UnsignedIntegerTypeRoleSet *allowedRoles)

{
  string msg;
  TextLocation loc;
  Set set;
  undefined8 in_stack_ffffffffffffff40;
  UnsignedIntegerTypeRoleSet **ppUVar1;
  undefined8 uVar2;
  code *pcVar3;
  undefined1 local_98 [40];
  undefined1 *local_70;
  undefined1 local_60 [16];
  UnsignedIntegerTypeRoleSet *local_50;
  _Hashtable<const_yactfr::internal::PseudoDt_*,_const_yactfr::internal::PseudoDt_*,_std::allocator<const_yactfr::internal::PseudoDt_*>,_std::__detail::_Identity,_std::equal_to<const_yactfr::internal::PseudoDt_*>,_std::hash<const_yactfr::internal::PseudoDt_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_48;
  
  if (pseudoDt != (PseudoDt *)0x0) {
    ppUVar1 = &local_50;
    uVar2 = 0;
    local_98._24_8_ =
         std::
         _Function_handler<bool_(const_yactfr::internal::PseudoDt_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/eepp[P]yactfr/yactfr/internal/metadata/pseudo-dt-utils.hpp:36:40)>
         ::_M_invoke;
    local_98._8_8_ = 0;
    local_98._16_8_ =
         std::
         _Function_handler<bool_(const_yactfr::internal::PseudoDt_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/eepp[P]yactfr/yactfr/internal/metadata/pseudo-dt-utils.hpp:36:40)>
         ::_M_manager;
    pcVar3 = (code *)0x0;
    local_98._0_8_ = ppUVar1;
    local_50 = allowedRoles;
    commonFindPseudoDts<yactfr::internal::PseudoDtFinder<yactfr::internal::ConstPseudoDtVisitor>,yactfr::internal::PseudoDt_const>
              ((Set *)&local_48,(internal *)pseudoDt,(PseudoDt *)local_98,
               (PredFunc *)
               std::
               _Function_handler<bool_(const_yactfr::internal::PseudoDt_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/eepp[P]yactfr/yactfr/internal/metadata/pseudo-dt-utils.hpp:36:40)>
               ::_M_manager);
    if ((code *)local_98._16_8_ != (code *)0x0) {
      (*(code *)local_98._16_8_)(local_98,local_98,3);
      if (pcVar3 != (code *)0x0) {
        (*pcVar3)(&stack0xffffffffffffff48,&stack0xffffffffffffff48,3);
      }
    }
    if (local_48._M_element_count != 0) {
      local_70 = local_60;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_70,
                 "Unsigned integer type has at least one invalid role within its scope.","");
      msg.field_2._8_8_ = in_stack_ffffffffffffff40;
      msg._0_24_ = *(undefined1 (*) [24])(local_48._M_before_begin._M_nxt[1]._M_nxt + 1);
      loc._lineNumber = uVar2;
      loc._offset = (Index)ppUVar1;
      loc._colNumber = (Index)pcVar3;
      throwTextParseError(msg,loc);
    }
    std::
    _Hashtable<const_yactfr::internal::PseudoDt_*,_const_yactfr::internal::PseudoDt_*,_std::allocator<const_yactfr::internal::PseudoDt_*>,_std::__detail::_Identity,_std::equal_to<const_yactfr::internal::PseudoDt_*>,_std::hash<const_yactfr::internal::PseudoDt_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable(&local_48);
  }
  return;
}

Assistant:

void validatePseudoUIntTypeRoles(const PseudoDt * const pseudoDt,
                                 const UnsignedIntegerTypeRoleSet& allowedRoles)
{
    if (!pseudoDt) {
        return;
    }

    // find _invalid_ pseudo unsigned integer types
    const auto set = findPseudoUIntTypes(*pseudoDt, [&allowedRoles](auto& pseudoUIntType, auto) {
        // get roles
        auto& roles = call([&pseudoUIntType]() -> const UnsignedIntegerTypeRoleSet& {
            if (isFlUIntNotDtWrapper(pseudoUIntType)) {
                return static_cast<const PseudoFlUIntType&>(pseudoUIntType).roles();
            } else {
                assert(pseudoUIntType.kind() == PseudoDt::Kind::ScalarDtWrapper);

                auto& dt = static_cast<const PseudoScalarDtWrapper&>(pseudoUIntType).dt();

                if (dt.isFixedLengthUnsignedIntegerType()) {
                    return dt.asFixedLengthUnsignedIntegerType().roles();
                } else {
                    assert(dt.isVariableLengthUnsignedIntegerType());
                    return dt.asVariableLengthUnsignedIntegerType().roles();
                }
            }
        });

        for (auto& role : roles) {
            if (allowedRoles.count(role) == 0) {
                // invalid: `role` is not an element of `allowedRoles`
                return true;
            }
        }

        return false;
    });

    if (!set.empty()) {
        throwTextParseError("Unsigned integer type has at least one invalid role within its scope.",
                            (*set.begin())->loc());
    }
}